

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O1

CordRepBtree *
absl::lts_20240722::cord_internal::CordRepBtree::ConsumeBeginTo
          (CordRepBtree *tree,size_t end,size_t new_length)

{
  RefcountAndFlags *pRVar1;
  int *piVar2;
  byte bVar3;
  uint uVar4;
  CordRep *rep;
  long lVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  CordRepBtree *pCVar11;
  long lVar12;
  
  if ((tree->super_CordRep).storage[2] < end) {
    __assert_fail("end <= tree->end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                  ,0x33c,
                  "static CordRepBtree *absl::cord_internal::CordRepBtree::ConsumeBeginTo(CordRepBtree *, size_t, size_t)"
                 );
  }
  if ((tree->super_CordRep).refcount.count_.super___atomic_base<int>._M_i == 2) {
    bVar3 = (tree->super_CordRep).storage[2];
    if (bVar3 < end) {
      __assert_fail("begin <= end",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                    ,0x277,
                    "absl::Span<CordRep *const> absl::cord_internal::CordRepBtree::Edges(size_t, size_t) const"
                   );
    }
    if (end < (tree->super_CordRep).storage[1]) {
      __assert_fail("begin >= this->begin()",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                    ,0x278,
                    "absl::Span<CordRep *const> absl::cord_internal::CordRepBtree::Edges(size_t, size_t) const"
                   );
    }
    if (bVar3 != end) {
      lVar12 = end * 8;
      do {
        rep = *(CordRep **)((long)tree->edges_ + lVar12);
        uVar4 = (rep->refcount).count_.super___atomic_base<int>._M_i;
        if ((uVar4 & 1) == 0 && (int)uVar4 < 1) {
          __assert_fail("refcount > 0 || refcount & kImmortalFlag",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_internal.h"
                        ,0xa0,"bool absl::cord_internal::RefcountAndFlags::Decrement()");
        }
        if (uVar4 == 2) {
LAB_00106828:
          CordRep::Destroy(rep);
        }
        else {
          pRVar1 = &rep->refcount;
          LOCK();
          (pRVar1->count_).super___atomic_base<int>._M_i =
               (pRVar1->count_).super___atomic_base<int>._M_i + -2;
          UNLOCK();
          if ((pRVar1->count_).super___atomic_base<int>._M_i == 0) goto LAB_00106828;
        }
        lVar12 = lVar12 + 8;
      } while ((ulong)bVar3 * 8 != lVar12);
    }
    (tree->super_CordRep).storage[2] = (uint8_t)end;
    (tree->super_CordRep).length = new_length;
    pCVar11 = tree;
  }
  else {
    if (6 < end) {
      __assert_fail("end <= capacity()",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                    ,0x2cb,
                    "CordRepBtree *absl::cord_internal::CordRepBtree::CopyBeginTo(size_t, size_t) const"
                   );
    }
    if (end < (tree->super_CordRep).storage[1]) {
      __assert_fail("end >= this->begin()",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                    ,0x2cc,
                    "CordRepBtree *absl::cord_internal::CordRepBtree::CopyBeginTo(size_t, size_t) const"
                   );
    }
    pCVar11 = (CordRepBtree *)operator_new(0x40);
    (pCVar11->super_CordRep).refcount.count_.super___atomic_base<int>._M_i = 2;
    (pCVar11->super_CordRep).length = new_length;
    uVar6 = *(undefined8 *)((long)tree->edges_ + 4);
    uVar7 = *(undefined8 *)((long)tree->edges_ + 0xc);
    uVar8 = *(undefined8 *)((long)tree->edges_ + 0x14);
    uVar9 = *(undefined8 *)((long)tree->edges_ + 0x1c);
    uVar10 = *(undefined8 *)((long)tree->edges_ + 0x24);
    *(undefined8 *)&(pCVar11->super_CordRep).tag = *(undefined8 *)&(tree->super_CordRep).tag;
    *(undefined8 *)((long)pCVar11->edges_ + 4) = uVar6;
    *(undefined8 *)((long)pCVar11->edges_ + 0xc) = uVar7;
    *(undefined8 *)((long)pCVar11->edges_ + 0x14) = uVar8;
    *(undefined8 *)((long)pCVar11->edges_ + 0x1c) = uVar9;
    *(undefined8 *)((long)pCVar11->edges_ + 0x24) = uVar10;
    *(undefined4 *)((long)pCVar11->edges_ + 0x2c) = *(undefined4 *)((long)tree->edges_ + 0x2c);
    (pCVar11->super_CordRep).storage[2] = (uint8_t)end;
    bVar3 = (pCVar11->super_CordRep).storage[1];
    if (bVar3 != end) {
      lVar12 = (ulong)bVar3 << 3;
      do {
        lVar5 = *(long *)((long)pCVar11->edges_ + lVar12);
        if (lVar5 == 0) {
          __assert_fail("rep != nullptr",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_internal.h"
                        ,0x370,"static CordRep *absl::cord_internal::CordRep::Ref(CordRep *)");
        }
        LOCK();
        piVar2 = (int *)(lVar5 + 8);
        *piVar2 = *piVar2 + 2;
        UNLOCK();
        lVar12 = lVar12 + 8;
      } while (end << 3 != lVar12);
    }
    if (tree == (CordRepBtree *)0x0) {
      __assert_fail("rep != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_internal.h"
                    ,0x376,"static void absl::cord_internal::CordRep::Unref(CordRep *)");
    }
    LOCK();
    pRVar1 = &(tree->super_CordRep).refcount;
    uVar4 = (pRVar1->count_).super___atomic_base<int>._M_i;
    (pRVar1->count_).super___atomic_base<int>._M_i =
         (pRVar1->count_).super___atomic_base<int>._M_i + -2;
    UNLOCK();
    if ((uVar4 & 1) == 0 && (int)uVar4 < 1) {
      __assert_fail("refcount > 0 || refcount & kImmortalFlag",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_internal.h"
                    ,0xaa,
                    "bool absl::cord_internal::RefcountAndFlags::DecrementExpectHighRefcount()");
    }
    if (uVar4 == 2) {
      CordRep::Destroy(&tree->super_CordRep);
    }
  }
  return pCVar11;
}

Assistant:

inline CordRepBtree* Unwind(CordRepBtree* tree, int depth, size_t length,
                              OpResult result) {
    // TODO(mvels): revisit the below code to check if 3 loops with 3
    // (incremental) conditions is faster than 1 loop with a switch.
    // Benchmarking and perf recordings indicate the loop with switch is
    // fastest, likely because of indirect jumps on the tight case values and
    // dense branches. But it's worth considering 3 loops, as the `action`
    // transitions are mono directional. E.g.:
    //   while (action == kPopped) {
    //     ...
    //   }
    //   while (action == kCopied) {
    //     ...
    //   }
    //   ...
    // We also  found that an "if () do {}" loop here seems faster, possibly
    // because it allows the branch predictor more granular heuristics on
    // 'single leaf' (`depth` == 0) and 'single depth' (`depth` == 1) cases
    // which appear to be the most common use cases.
    if (depth != 0) {
      do {
        CordRepBtree* node = stack[--depth];
        const bool owned = depth < share_depth;
        switch (result.action) {
          case CordRepBtree::kPopped:
            assert(!propagate);
            result = node->AddEdge<edge_type>(owned, result.tree, length);
            break;
          case CordRepBtree::kCopied:
            result = node->SetEdge<edge_type>(owned, result.tree, length);
            if (propagate) stack[depth] = result.tree;
            break;
          case CordRepBtree::kSelf:
            node->length += length;
            while (depth > 0) {
              node = stack[--depth];
              node->length += length;
            }
            return node;
        }
      } while (depth > 0);
    }
    return Finalize(tree, result);
  }